

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.cpp
# Opt level: O0

void __thiscall CControls::ClampMousePos(CControls *this)

{
  long lVar1;
  int iVar2;
  CCollision *pCVar3;
  vector2_base<float> *in_RDI;
  long in_FS_OFFSET;
  float fVar4;
  float fVar5;
  vector2_base<float> vVar6;
  float MouseMax;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  vector2_base<float> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(byte *)((long)in_RDI[1] + 0x1628) & 1) == 0) ||
     ((*(byte *)((long)in_RDI[1] + 0x1634) & 1) != 0)) {
    this_00 = in_RDI;
    fVar4 = GetMaxMouseDistance((CControls *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    fVar5 = dot<float>(in_RDI + 2,in_RDI + 2);
    if (fVar4 * fVar4 < fVar5) {
      normalize((vector2_base<float> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
               );
      vVar6 = vector2_base<float>::operator*(this_00,fVar4);
      in_RDI[2] = vVar6;
    }
  }
  else {
    fVar4 = in_RDI[2].field_0.x;
    pCVar3 = CComponent::Collision((CComponent *)0x159a20);
    iVar2 = CCollision::GetWidth(pCVar3);
    fVar4 = clamp<float>(fVar4,200.0,(float)(iVar2 << 5) - 200.0);
    in_RDI[2].field_0.x = fVar4;
    fVar4 = in_RDI[2].field_1.y;
    pCVar3 = CComponent::Collision((CComponent *)0x159a67);
    iVar2 = CCollision::GetHeight(pCVar3);
    fVar4 = clamp<float>(fVar4,200.0,(float)(iVar2 << 5) - 200.0);
    in_RDI[2].field_1.y = fVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CControls::ClampMousePos()
{
	if(m_pClient->m_Snap.m_SpecInfo.m_Active && !m_pClient->m_Snap.m_SpecInfo.m_UsePosition)
	{
		m_MousePos.x = clamp(m_MousePos.x, 200.0f, Collision()->GetWidth()*32-200.0f);
		m_MousePos.y = clamp(m_MousePos.y, 200.0f, Collision()->GetHeight()*32-200.0f);
	}
	else
	{
		const float MouseMax = GetMaxMouseDistance();
		if(dot(m_MousePos, m_MousePos) > MouseMax * MouseMax)
			m_MousePos = normalize(m_MousePos) * MouseMax;
	}
}